

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O3

deBool qpXmlWriter_writeBase64(qpXmlWriter *writer,deUint8 *data,size_t numBytes)

{
  qpXmlWriter *pqVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  char d [5];
  char local_4d;
  char local_4c;
  char local_4b;
  char local_4a;
  undefined1 local_49;
  qpXmlWriter *local_48;
  char *local_40;
  deUint8 *local_38;
  
  iVar5 = writer->xmlElementDepth;
  if (0x1f < iVar5) {
    iVar5 = 0x20;
  }
  local_38 = data;
  if (writer->xmlPrevIsStartElement != 0) {
    fwrite(">\n",2,1,(FILE *)writer->outputFile);
    writer->xmlPrevIsStartElement = 0;
  }
  if (numBytes != 0) {
    local_40 = getIndentStr_s_indentStr + (0x20 - iVar5);
    uVar7 = 0;
    bVar9 = false;
    iVar5 = 0;
    local_48 = writer;
    do {
      while( true ) {
        pqVar1 = local_48;
        uVar4 = (int)numBytes - (int)uVar7;
        uVar6 = 3;
        if ((int)uVar4 < 3) {
          uVar6 = uVar4;
        }
        bVar3 = 0;
        uVar2 = 0;
        if (1 < uVar6) {
          bVar3 = local_38[uVar7 + 1];
          if (uVar4 == 2) {
            uVar2 = 0;
          }
          else {
            uVar2 = (uint)local_38[uVar7 + 2];
          }
        }
        local_4d = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [local_38[uVar7] >> 2];
        local_4c = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(bVar3 >> 4) | (local_38[uVar7] & 3) << 4];
        local_4b = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uVar2 >> 6) + (bVar3 & 0xf) * 4];
        local_4a = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar2 & 0x3f];
        local_49 = 0;
        if (uVar6 < 3) {
          local_4a = '=';
        }
        if (uVar6 < 2) {
          local_4b = '=';
        }
        if (!bVar9) {
          fputs(local_40,(FILE *)local_48->outputFile);
        }
        uVar7 = uVar7 + (long)(int)uVar6;
        fputs(&local_4d,(FILE *)pqVar1->outputFile);
        iVar8 = iVar5 + 4;
        bVar9 = iVar8 < 0x40;
        if (SBORROW4(iVar8,0x40) == iVar5 + -0x3c < 0) break;
        iVar5 = iVar8;
        if (numBytes <= uVar7) {
          if (iVar8 < 1) {
            return 1;
          }
          fputc(10,(FILE *)local_48->outputFile);
          return 1;
        }
      }
      fputc(10,(FILE *)local_48->outputFile);
      iVar5 = 0;
    } while (uVar7 < numBytes);
  }
  return 1;
}

Assistant:

deBool qpXmlWriter_writeBase64 (qpXmlWriter* writer, const deUint8* data, size_t numBytes)
{
	static const char s_base64Table[64] =
	{
		'A','B','C','D','E','F','G','H','I','J','K','L','M',
		'N','O','P','Q','R','S','T','U','V','W','X','Y','Z',
		'a','b','c','d','e','f','g','h','i','j','k','l','m',
		'n','o','p','q','r','s','t','u','v','w','x','y','z',
		'0','1','2','3','4','5','6','7','8','9','+','/'
	};

	int			numWritten	= 0;
	size_t		srcNdx		= 0;
	deBool		writeIndent	= DE_TRUE;
	const char*	indentStr	= getIndentStr(writer->xmlElementDepth);

	DE_ASSERT(writer && data && (numBytes > 0));

	/* Close and pending writes. */
	closePending(writer);

	/* Loop all input chars. */
	while (srcNdx < numBytes)
	{
		size_t	numRead = (size_t)deMin32(3, (int)(numBytes - srcNdx));
		deUint8	s0 = data[srcNdx];
		deUint8	s1 = (numRead >= 2) ? data[srcNdx+1] : 0;
		deUint8	s2 = (numRead >= 3) ? data[srcNdx+2] : 0;
		char	d[5];

		srcNdx += numRead;

		d[0] = s_base64Table[s0 >> 2];
		d[1] = s_base64Table[((s0&0x3)<<4) | (s1>>4)];
		d[2] = s_base64Table[((s1&0xF)<<2) | (s2>>6)];
		d[3] = s_base64Table[s2&0x3F];
		d[4] = 0;

		if (numRead < 3) d[3] = '=';
		if (numRead < 2) d[2] = '=';

		/* Write indent (if needed). */
		if (writeIndent)
		{
			fprintf(writer->outputFile, "%s", indentStr);
			writeIndent = DE_FALSE;
		}

		/* Write data. */
		fprintf(writer->outputFile, "%s", &d[0]);

		/* EOL every now and then. */
		numWritten += 4;
		if (numWritten >= 64)
		{
			fprintf(writer->outputFile, "\n");
			numWritten = 0;
			writeIndent = DE_TRUE;
		}
	}

	/* Last EOL. */
	if (numWritten > 0)
		fprintf(writer->outputFile, "\n");

	DE_ASSERT(srcNdx == numBytes);
	return DE_TRUE;
}